

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

void Gia_QbfAddSpecialConstr(Qbf_Man_t *p)

{
  int iVar1;
  uint i;
  int Lits [2];
  
  i = 0;
  do {
    if (i == 0x2c) {
      return;
    }
    if ((i & 3) == 0) {
      iVar1 = Vec_IntEntry(p->vParMap,i);
      if (iVar1 != -1) {
        __assert_fail("Vec_IntEntry(p->vParMap, i) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaQbf.c"
                      ,0x231,"void Gia_QbfAddSpecialConstr(Qbf_Man_t *)");
      }
      Vec_IntWriteEntry(p->vParMap,i,0);
      Lits[0] = Abc_Var2Lit(i,1);
      iVar1 = sat_solver_addclause(p->pSatSyn,Lits,Lits + 1);
      if (iVar1 == 0) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaQbf.c"
                      ,0x235,"void Gia_QbfAddSpecialConstr(Qbf_Man_t *)");
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Gia_QbfAddSpecialConstr( Qbf_Man_t * p )
{
    int i, status, Lits[2];
    for ( i = 0; i < 4*11; i++ )
        if ( i % 4 == 0 )
        {
            assert( Vec_IntEntry(p->vParMap, i) == -1 );
            Vec_IntWriteEntry( p->vParMap, i, (i % 4) == 3 );
            Lits[0] = Abc_Var2Lit( i, (i % 4) != 3 );
            status = sat_solver_addclause( p->pSatSyn, Lits, Lits+1 );
            assert( status );
        }
}